

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

bool __thiscall
density::
heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
::operator==(heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
             *this,heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>,_density::basic_default_allocator<65536UL>_>
                   *i_source)

{
  bool bVar1;
  const_iterator it_1;
  const_iterator it_2;
  undefined1 local_58 [32];
  const_iterator local_38;
  
  cbegin(&local_38,i_source);
  cbegin((const_iterator *)local_58,this);
  if ((ControlBlock *)local_58._0_8_ != (ControlBlock *)0x0) {
    do {
      if (((local_38.m_control == (ControlBlock *)0x0) ||
          ((runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
            )local_58._24_8_ != local_38.m_value.m_pair.m_type.m_feature_table)) ||
         (bVar1 = runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
                  ::are_equal((runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_equal>
                               *)(local_58 + 0x18),(void *)local_58._16_8_,
                              local_38.m_value.m_pair.m_address), !bVar1)) {
        return false;
      }
      const_iterator::operator++((const_iterator *)local_58);
      const_iterator::operator++(&local_38);
    } while ((ControlBlock *)local_58._0_8_ != (ControlBlock *)0x0);
  }
  return local_38.m_control == (ControlBlock *)0x0;
}

Assistant:

bool operator==(const heter_queue & i_source) const
        {
            const auto end_1 = cend();
            const auto end_2 = i_source.cend();
            auto       it_2  = i_source.cbegin();
            for (auto it_1 = cbegin(); it_1 != end_1; ++it_1, ++it_2)
            {
                if (
                  it_2 == end_2 || it_1.complete_type() != it_2.complete_type() ||
                  !it_1.complete_type().are_equal(it_1.element_ptr(), it_2.element_ptr()))
                {
                    return false;
                }
            }
            return it_2 == end_2;
        }